

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

bool __thiscall Matrix::CopyColumn(Matrix *this,int source_column,int destination_column)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  int local_28;
  int row;
  bool result;
  int destination_column_local;
  int source_column_local;
  Matrix *this_local;
  
  if (source_column == destination_column) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = false;
    for (local_28 = 0; local_28 < this->n_; local_28 = local_28 + 1) {
      pvVar2 = std::
               vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
               ::operator[](&this->elements_,(long)local_28);
      pvVar3 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[]
                         (pvVar2,(long)destination_column);
      pvVar2 = std::
               vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
               ::operator[](&this->elements_,(long)local_28);
      pvVar4 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[]
                         (pvVar2,(long)source_column);
      bVar1 = operator!=(pvVar3,pvVar4);
      if (bVar1) {
        this_local._7_1_ = true;
        pvVar2 = std::
                 vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ::operator[](&this->elements_,(long)local_28);
        pvVar3 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[]
                           (pvVar2,(long)source_column);
        pvVar2 = std::
                 vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ::operator[](&this->elements_,(long)local_28);
        pvVar4 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[]
                           (pvVar2,(long)destination_column);
        *pvVar4 = *pvVar3;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Matrix::CopyColumn(int source_column, int destination_column) {
  if (source_column == destination_column) {
    return false;
  }

  bool result = false;
  for (int row = 0; row < n_; ++row) {
    if (elements_[row][destination_column] != elements_[row][source_column]) {
      result = true;
      elements_[row][destination_column] = elements_[row][source_column];
    }
  }

  return result;
}